

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

int Saig_RefManSetPhases(Saig_RefMan_t *p,Abc_Cex_t *pCare,int fValue1)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  int iInput;
  int iFrame;
  int i;
  Aig_Obj_t *pObj;
  int fValue1_local;
  Abc_Cex_t *pCare_local;
  Saig_RefMan_t *p_local;
  
  pAVar7 = Aig_ManConst1(p->pFrames);
  *(ulong *)&pAVar7->field_0x18 = *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff7 | 8;
  for (iInput = 0; iVar3 = Vec_PtrSize(p->pFrames->vCis), iInput < iVar3; iInput = iInput + 1) {
    pvVar8 = Vec_PtrEntry(p->pFrames->vCis,iInput);
    iVar3 = Vec_IntEntry(p->vMapPiF2A,iInput << 1);
    iVar4 = Vec_IntEntry(p->vMapPiF2A,iInput * 2 + 1);
    uVar6 = Abc_InfoHasBit((uint *)(p->pCex + 1),p->pCex->nRegs + p->pCex->nPis * iVar4 + iVar3);
    *(ulong *)((long)pvVar8 + 0x18) =
         *(ulong *)((long)pvVar8 + 0x18) & 0xfffffffffffffff7 | ((ulong)uVar6 & 1) << 3;
    if ((pCare != (Abc_Cex_t *)0x0) &&
       (iVar3 = Abc_InfoHasBit((uint *)(pCare + 1),p->pCex->nRegs + p->pCex->nPis * iVar4 + iVar3),
       iVar3 == 0)) {
      *(ulong *)((long)pvVar8 + 0x18) =
           *(ulong *)((long)pvVar8 + 0x18) & 0xfffffffffffffff7 | ((ulong)(uint)fValue1 & 1) << 3;
    }
  }
  for (iInput = 0; iVar3 = Vec_PtrSize(p->pFrames->vObjs), iInput < iVar3; iInput = iInput + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pFrames->vObjs,iInput);
    if ((pAVar7 != (Aig_Obj_t *)0x0) && (iVar3 = Aig_ObjIsNode(pAVar7), iVar3 != 0)) {
      pAVar9 = Aig_ObjFanin0(pAVar7);
      uVar2 = *(ulong *)&pAVar9->field_0x18;
      uVar6 = Aig_ObjFaninC0(pAVar7);
      pAVar9 = Aig_ObjFanin1(pAVar7);
      uVar1 = *(ulong *)&pAVar9->field_0x18;
      uVar5 = Aig_ObjFaninC1(pAVar7);
      *(ulong *)&pAVar7->field_0x18 =
           *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff7 |
           ((ulong)(((uint)(uVar2 >> 3) & 1 ^ uVar6) & ((uint)(uVar1 >> 3) & 1 ^ uVar5)) & 1) << 3;
    }
  }
  for (iInput = 0; iVar3 = Vec_PtrSize(p->pFrames->vCos), iInput < iVar3; iInput = iInput + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->pFrames->vCos,iInput);
    pAVar9 = Aig_ObjFanin0(pAVar7);
    uVar2 = *(ulong *)&pAVar9->field_0x18;
    uVar6 = Aig_ObjFaninC0(pAVar7);
    *(ulong *)&pAVar7->field_0x18 =
         *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff7 |
         ((ulong)((uint)(uVar2 >> 3) & 1 ^ uVar6) & 1) << 3;
  }
  pAVar7 = Aig_ManCo(p->pFrames,0);
  return (uint)(*(ulong *)&pAVar7->field_0x18 >> 3) & 1;
}

Assistant:

int Saig_RefManSetPhases( Saig_RefMan_t * p, Abc_Cex_t * pCare, int fValue1 )
{
    Aig_Obj_t * pObj;
    int i, iFrame, iInput;
    Aig_ManConst1( p->pFrames )->fPhase = 1;
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        pObj->fPhase = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        // update value if it is a don't-care
        if ( pCare && !Abc_InfoHasBit( pCare->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput ) )
            pObj->fPhase = fValue1;
    }
    Aig_ManForEachNode( p->pFrames, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj) );
    Aig_ManForEachCo( p->pFrames, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) );
    pObj = Aig_ManCo( p->pFrames, 0 );
    return pObj->fPhase;
}